

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O2

Gia_Man_t * Acec_RewriteReplace(Gia_Man_t *p,Vec_Int_t *vRes)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  
  if (p->vCos->nSize != vRes->nSize) {
    __assert_fail("Gia_ManCoNum(p) == Vec_IntSize(vRes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCl.c"
                  ,0x186,"Gia_Man_t *Acec_RewriteReplace(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < p->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCi(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar2;
  }
  for (iVar8 = 0; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      iLit1 = Gia_ObjFanin1Copy(pGVar5);
      uVar2 = Gia_ManAppendAnd(p_00,iVar3,iLit1);
      pGVar5->Value = uVar2;
    }
  }
  for (iVar8 = 0; iVar8 < p->vCos->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar3 = Vec_IntEntry(vRes,iVar8);
    iVar3 = Abc_Lit2Var(iVar3);
    pGVar6 = Gia_ManObj(p,iVar3);
    uVar2 = Gia_ManAppendCo(p_00,pGVar6->Value);
    pGVar5->Value = uVar2;
  }
  Gia_ManSetPhase(p);
  Gia_ManSetPhase(p_00);
  for (iVar8 = 0; iVar8 < p_00->vCos->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(p_00,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pGVar5;
    pGVar6 = Gia_ManCo(p,iVar8);
    if ((long)(uVar1 ^ *(ulong *)pGVar6) < 0) {
      uVar2 = (uint)*(ulong *)pGVar5;
      if ((-1 < (int)uVar2) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x219,"void Gia_ObjFlipFaninC0(Gia_Obj_t *)");
      }
      *(ulong *)pGVar5 = *(ulong *)pGVar5 ^ 0x20000000;
    }
  }
  pGVar7 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Acec_RewriteReplace( Gia_Man_t * p, Vec_Int_t * vRes )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    assert( Gia_ManCoNum(p) == Vec_IntSize(vRes) );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
    {
        int iLit = Vec_IntEntry( vRes, i );
        Gia_Obj_t * pRepr = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        pObj->Value = Gia_ManAppendCo( pNew, pRepr->Value );
    }
    // set correct phase
    Gia_ManSetPhase( p );
    Gia_ManSetPhase( pNew );
    Gia_ManForEachCo( pNew, pObj, i )
        if ( Gia_ObjPhase(pObj) != Gia_ObjPhase(Gia_ManCo(p, i)) )
            Gia_ObjFlipFaninC0( pObj );
    // remove dangling nodes
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}